

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * cast_expression(dmr_C *C,token *token,expression **tree)

{
  position pVar1;
  symbol *psVar2;
  token *ptVar3;
  expression *cast_init_expr;
  expression *local_48;
  expression *v;
  symbol *sym;
  int is_force;
  
  if (((((ulong)token->pos & 0x3f) == 0x11) && ((token->field_2).special == 0x28)) &&
     (ptVar3 = token->next, ((ulong)ptVar3->pos & 0x3f) == 2)) {
    psVar2 = dmrC_lookup_symbol((ptVar3->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    if ((psVar2 != (symbol *)0x0) && ((psVar2->field_0x1 & 2) != 0)) {
      pVar1 = ptVar3->pos;
      cast_init_expr = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)cast_init_expr = 0xb;
      cast_init_expr->pos = pVar1;
      ptVar3 = dmrC_typename(C,ptVar3,(symbol **)&v,(int *)((long)&sym + 4));
      (cast_init_expr->field_5).field_3.unop = v;
      ptVar3 = dmrC_expect_token(C,ptVar3,0x29,"at end of cast operator");
      if ((((ulong)ptVar3->pos & 0x3f) == 0x11) && ((ptVar3->field_2).special == 0x7b)) {
        if (sym._4_4_ != 0) {
          dmrC_warning(C,*(position *)&v->op,"[force] in compound literal");
        }
        ptVar3 = dmrC_initializer(C,&(cast_init_expr->field_5).field_6.right,ptVar3);
        ptVar3 = postfix_expression(C,ptVar3,tree,cast_init_expr);
      }
      else {
        *tree = cast_init_expr;
        if (sym._4_4_ != 0) {
          *(undefined1 *)cast_init_expr = 0xc;
        }
        ptVar3 = cast_expression(C,ptVar3,&local_48);
        if (local_48 != (expression *)0x0) {
          (cast_init_expr->field_5).field_2.string = (string *)local_48;
          if ((*(ushort *)local_48 >> 8 & 1) == 0) {
            if ((*(ushort *)local_48 >> 8 & 2) != 0) {
              cast_init_expr->field_0x1 = 3;
            }
          }
          else {
            cast_init_expr->field_0x1 = 1;
          }
        }
      }
      return ptVar3;
    }
  }
  ptVar3 = unary_expression(C,token,tree);
  return ptVar3;
}

Assistant:

static struct token *cast_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	if (dmrC_match_op(token, '(')) {
		struct token *next = token->next;
		if (dmrC_lookup_type(next)) {
			struct expression *cast = dmrC_alloc_expression(C, next->pos, EXPR_CAST);
			struct expression *v;
			struct symbol *sym;
			int is_force;

			token = dmrC_typename(C, next, &sym, &is_force);
			cast->cast_type = sym;
			token = dmrC_expect_token(C, token, ')', "at end of cast operator");
			if (dmrC_match_op(token, '{')) {
				if (is_force)
					dmrC_warning(C, sym->pos,
						"[force] in compound literal");
				token = dmrC_initializer(C, &cast->cast_expression, token);
				return postfix_expression(C, token, tree, cast);
			}
			*tree = cast;
			if (is_force)
				cast->type = EXPR_FORCE_CAST;
			token = cast_expression(C, token, &v);
			if (!v)
				return token;
			cast->cast_expression = v;
			if (v->flags & Int_const_expr)
				cast->flags = Int_const_expr;
			else if (v->flags & Float_literal) /* and _not_ int */
				cast->flags = Int_const_expr | Float_literal;
			return token;
		}
	}
	return unary_expression(C, token, tree);
}